

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O3

void __thiscall
btHingeConstraint::btHingeConstraint
          (btHingeConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btVector3 *pivotInA,
          btVector3 *pivotInB,btVector3 *axisInA,btVector3 *axisInB,bool useReferenceFrameA)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  btScalar bVar6;
  float fVar7;
  btScalar bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  btScalar bVar14;
  btScalar bVar15;
  float fVar16;
  btScalar bVar17;
  btScalar bVar18;
  float fVar19;
  float fVar20;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,HINGE_CONSTRAINT_TYPE,rbA,rbB)
  ;
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00220380;
  (this->m_limit).m_center = 0.0;
  (this->m_limit).m_halfRange = -1.0;
  (this->m_limit).m_softness = 0.9;
  (this->m_limit).m_biasFactor = 0.3;
  (this->m_limit).m_relaxationFactor = 1.0;
  (this->m_limit).m_correction = 0.0;
  (this->m_limit).m_sign = 0.0;
  (this->m_limit).m_solveLimit = false;
  this->m_angularOnly = false;
  this->m_enableAngularMotor = false;
  this->m_useSolveConstraintObsolete = false;
  this->m_useOffsetForConstraintFrame = true;
  this->m_useReferenceFrameA = useReferenceFrameA;
  this->m_flags = 0;
  this->m_normalCFM = 0.0;
  this->m_normalERP = 0.0;
  this->m_stopCFM = 0.0;
  this->m_stopERP = 0.0;
  uVar1 = *(undefined8 *)(pivotInA->m_floats + 2);
  *(undefined8 *)(this->m_rbAFrame).m_origin.m_floats = *(undefined8 *)pivotInA->m_floats;
  *(undefined8 *)((this->m_rbAFrame).m_origin.m_floats + 2) = uVar1;
  fVar19 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0];
  fVar4 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0];
  fVar20 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[0];
  fVar2 = (float)*(undefined8 *)axisInA->m_floats;
  fVar5 = (float)((ulong)*(undefined8 *)axisInA->m_floats >> 0x20);
  fVar7 = axisInA->m_floats[2];
  fVar13 = fVar7 * fVar20 + fVar2 * fVar19 + fVar4 * fVar5;
  if (0.9999999 <= fVar13) {
    bVar17 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    bVar18 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar15 = -(rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
    bVar6 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    bVar14 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
  }
  else {
    if (-0.9999999 < fVar13) {
      bVar14 = fVar5 * fVar20 - fVar4 * fVar7;
      bVar6 = fVar19 * fVar7 - fVar20 * fVar2;
      bVar8 = fVar4 * fVar2 - fVar19 * fVar5;
      bVar17 = fVar7 * bVar6 - fVar5 * bVar8;
      bVar18 = fVar2 * bVar8 - fVar7 * bVar14;
      bVar15 = bVar14 * fVar5 - bVar6 * fVar2;
      goto LAB_001965f8;
    }
    bVar14 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1];
    bVar17 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2];
    bVar6 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1];
    bVar18 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2];
    bVar15 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2];
  }
  bVar8 = (rbA->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[1];
LAB_001965f8:
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[0] = bVar17;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[1] = bVar14;
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[2] = axisInA->m_floats[0];
  (this->m_rbAFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[0] = bVar18;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[1] = bVar6;
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[2] = axisInA->m_floats[1];
  (this->m_rbAFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[0] = bVar15;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[1] = bVar8;
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[2] = axisInA->m_floats[2];
  (this->m_rbAFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  fVar5 = (float)*(undefined8 *)(axisInA->m_floats + 1);
  fVar13 = (float)((ulong)*(undefined8 *)(axisInA->m_floats + 1) >> 0x20);
  fVar20 = (float)*(undefined8 *)(axisInB->m_floats + 1);
  fVar7 = (float)((ulong)*(undefined8 *)(axisInB->m_floats + 1) >> 0x20);
  fVar19 = axisInB->m_floats[0];
  fVar4 = axisInA->m_floats[0];
  fVar2 = fVar13 * fVar7 + fVar4 * fVar19 + fVar5 * fVar20;
  if (-0.9999999 <= fVar2) {
    fVar2 = fVar2 + 1.0;
    fVar2 = fVar2 + fVar2;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar3 = 1.0 / fVar2;
    fVar9 = fVar3 * (fVar5 * fVar7 + -fVar13 * fVar20);
    fVar13 = fVar3 * (fVar13 * fVar19 + -fVar4 * fVar7);
    fVar3 = fVar3 * (fVar4 * fVar20 + -fVar5 * fVar19);
    fVar2 = fVar2 * 0.5;
    fVar19 = axisInB->m_floats[0];
    fVar20 = axisInB->m_floats[1];
    fVar7 = axisInB->m_floats[2];
    useReferenceFrameA = this->m_useReferenceFrameA;
  }
  else {
    if (ABS(fVar13) <= 0.70710677) {
      fVar13 = 1.0 / SQRT(fVar4 * fVar4 + fVar5 * fVar5);
      fVar9 = -fVar5 * fVar13;
      fVar13 = fVar13 * fVar4;
      fVar3 = 0.0;
    }
    else {
      fVar3 = 1.0 / SQRT(fVar5 * fVar5 + fVar13 * fVar13);
      fVar13 = -fVar13 * fVar3;
      fVar3 = fVar3 * fVar5;
      fVar9 = 0.0;
    }
    fVar2 = 0.0;
  }
  fVar4 = (fVar2 * bVar18 + bVar17 * fVar3) - fVar9 * bVar15;
  fVar11 = (fVar2 * bVar15 + bVar18 * fVar9) - fVar13 * bVar17;
  fVar16 = (-fVar9 * bVar17 - bVar18 * fVar13) - bVar15 * fVar3;
  uVar1 = *(undefined8 *)(pivotInB->m_floats + 2);
  *(undefined8 *)(this->m_rbBFrame).m_origin.m_floats = *(undefined8 *)pivotInB->m_floats;
  *(undefined8 *)((this->m_rbBFrame).m_origin.m_floats + 2) = uVar1;
  fVar10 = (fVar2 * bVar17 + bVar15 * fVar13) - bVar18 * fVar3;
  fVar12 = fVar11 * fVar13 + ((fVar2 * fVar10 - fVar16 * fVar9) - fVar4 * fVar3);
  fVar5 = fVar4 * fVar9 + ((fVar2 * fVar11 - fVar16 * fVar3) - fVar13 * fVar10);
  fVar4 = fVar3 * fVar10 + ((fVar2 * fVar4 - fVar16 * fVar13) - fVar11 * fVar9);
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[0] = fVar12;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[1] = fVar20 * fVar5 - fVar7 * fVar4;
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[2] = axisInB->m_floats[0];
  (this->m_rbBFrame).m_basis.m_el[0].m_floats[3] = 0.0;
  *(ulong *)(this->m_rbBFrame).m_basis.m_el[1].m_floats =
       CONCAT44(fVar7 * fVar12 + -fVar19 * fVar5,fVar4);
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[2] = axisInB->m_floats[1];
  (this->m_rbBFrame).m_basis.m_el[1].m_floats[3] = 0.0;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[0] = fVar5;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[1] = fVar19 * fVar4 - fVar12 * fVar20;
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[2] = axisInB->m_floats[2];
  (this->m_rbBFrame).m_basis.m_el[2].m_floats[3] = 0.0;
  if ((useReferenceFrameA & 1U) == 0) {
    bVar6 = 1.0;
  }
  else {
    bVar6 = -1.0;
  }
  this->m_referenceSign = bVar6;
  return;
}

Assistant:

btHingeConstraint::btHingeConstraint(btRigidBody& rbA,btRigidBody& rbB, const btVector3& pivotInA,const btVector3& pivotInB,
									 const btVector3& axisInA,const btVector3& axisInB, bool useReferenceFrameA)
									 :btTypedConstraint(HINGE_CONSTRAINT_TYPE, rbA,rbB),
#ifdef _BT_USE_CENTER_LIMIT_
									 m_limit(),
#endif
									 m_angularOnly(false),
									 m_enableAngularMotor(false),
									 m_useSolveConstraintObsolete(HINGE_USE_OBSOLETE_SOLVER),
									 m_useOffsetForConstraintFrame(HINGE_USE_FRAME_OFFSET),
									 m_useReferenceFrameA(useReferenceFrameA),
									 m_flags(0),
									 m_normalCFM(0),
									 m_normalERP(0),
									 m_stopCFM(0),
									 m_stopERP(0)
{
	m_rbAFrame.getOrigin() = pivotInA;
	
	// since no frame is given, assume this to be zero angle and just pick rb transform axis
	btVector3 rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(0);

	btVector3 rbAxisA2;
	btScalar projection = axisInA.dot(rbAxisA1);
	if (projection >= 1.0f - SIMD_EPSILON) {
		rbAxisA1 = -rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);
	} else if (projection <= -1.0f + SIMD_EPSILON) {
		rbAxisA1 = rbA.getCenterOfMassTransform().getBasis().getColumn(2);
		rbAxisA2 = rbA.getCenterOfMassTransform().getBasis().getColumn(1);      
	} else {
		rbAxisA2 = axisInA.cross(rbAxisA1);
		rbAxisA1 = rbAxisA2.cross(axisInA);
	}

	m_rbAFrame.getBasis().setValue( rbAxisA1.getX(),rbAxisA2.getX(),axisInA.getX(),
									rbAxisA1.getY(),rbAxisA2.getY(),axisInA.getY(),
									rbAxisA1.getZ(),rbAxisA2.getZ(),axisInA.getZ() );

	btQuaternion rotationArc = shortestArcQuat(axisInA,axisInB);
	btVector3 rbAxisB1 =  quatRotate(rotationArc,rbAxisA1);
	btVector3 rbAxisB2 =  axisInB.cross(rbAxisB1);	
	
	m_rbBFrame.getOrigin() = pivotInB;
	m_rbBFrame.getBasis().setValue( rbAxisB1.getX(),rbAxisB2.getX(),axisInB.getX(),
									rbAxisB1.getY(),rbAxisB2.getY(),axisInB.getY(),
									rbAxisB1.getZ(),rbAxisB2.getZ(),axisInB.getZ() );
	
#ifndef	_BT_USE_CENTER_LIMIT_
	//start with free
	m_lowerLimit = btScalar(1.0f);
	m_upperLimit = btScalar(-1.0f);
	m_biasFactor = 0.3f;
	m_relaxationFactor = 1.0f;
	m_limitSoftness = 0.9f;
	m_solveLimit = false;
#endif
	m_referenceSign = m_useReferenceFrameA ? btScalar(-1.f) : btScalar(1.f);
}